

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest-main.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_FlagsValidatorDeathTest_InvalidFlagNeverSet::Run(void)

{
  bool bVar1;
  undefined8 extraout_RAX;
  FlagSaver fs;
  FlagSaver local_10;
  
  FlagSaver::FlagSaver(&local_10);
  fprintf(_stderr,"Running test %s/%s\n","FlagsValidatorDeathTest","InvalidFlagNeverSet");
  bVar1 = RegisterFlagValidator(&(anonymous_namespace)::fLI::FLAGS_test_flag,ValidateTestFlagIs5);
  _GLOBAL__N_1::Test_FlagsValidatorDeathTest_InvalidFlagNeverSet::Run
            ((Test_FlagsValidatorDeathTest_InvalidFlagNeverSet *)(ulong)bVar1);
  g_called_exit = '\0';
  gflags_exitfunc = CalledExit;
  ParseTestFlag(true,1,&PTR_anon_var_dwarf_1dfd3_0015bd60);
  gflags_exitfunc = exit;
  if (g_called_exit != '\0') {
    FlagSaver::~FlagSaver(&local_10);
    return;
  }
  _GLOBAL__N_1::Test_FlagsValidatorDeathTest_InvalidFlagNeverSet::Run();
  FlagSaver::~FlagSaver(&local_10);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(FlagsValidatorDeathTest, InvalidFlagNeverSet) {
  // If a flag keeps its default value, and that default value is
  // invalid, we should die at argv-parse time.
  const char* argv[] = {
    "my_test",
    NULL,
  };
  EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, &ValidateTestFlagIs5));
  EXPECT_DEATH(ParseTestFlag(true, arraysize(argv) - 1, argv),
               "ERROR: --test_flag must be set on the commandline");
}